

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libformula-calc.c
# Opt level: O0

int formula(char *expr,rpf_t **rpf,variables_t *variable)

{
  int iVar1;
  ushort **ppuVar2;
  rpf_t **pprVar3;
  size_t sVar4;
  void *pvVar5;
  rpf_t *prVar6;
  double dVar7;
  rpf_t **local_21b8;
  char *end_3;
  char local_21a8 [4];
  int i_1;
  char variable_name [256];
  char *end_2;
  rpf_t *rpf2_1;
  rpf_t **pprStack_2090;
  int rank2_1;
  char *end_1;
  rpf_t *prStack_2080;
  int sp_op2;
  rpf_t *rpf2;
  rpf_t **pprStack_2070;
  int rank2;
  char *end;
  rpf_t *prStack_2060;
  int op_cont;
  rpf_t *rpf_tmp;
  rpf_t rpf_start;
  int sp_num;
  int sp_op;
  stack_t num [256];
  stack_t op [256];
  int local_2c;
  int i;
  variables_t *variable_local;
  rpf_t **rpf_local;
  char *expr_local;
  
  *rpf = (rpf_t *)0x0;
  rpf_start.next._0_4_ = 0;
  rpf_start.next._4_4_ = 0;
  end._4_4_ = 0;
  rpf_local = (rpf_t **)expr;
  do {
    if (*(char *)rpf_local == '\0') {
LAB_00103a79:
      prVar6 = formula_output((stack_t *)&sp_num,(int *)&rpf_start.next,(stack_t *)&num[0xff].value,
                              (int *)((long)&rpf_start.next + 4),0);
      if (prVar6 == (rpf_t *)0x0) {
        expr_local._4_4_ = 0;
      }
      else if (((int)rpf_start.next < 0) || (rpf_start.next._4_4_ != 0)) {
        expr_local._4_4_ = 0;
      }
      else {
        rpf_tmp._0_4_ = 6;
        prStack_2060 = (rpf_t *)&rpf_tmp;
        while (rpf_start.next._0_4_ = (int)rpf_start.next + -1, -1 < (int)rpf_start.next) {
          if (*(int *)((long)&num[(long)(int)rpf_start.next + -1].value + 4) == 5) {
            prStack_2060 = rpf_join(prStack_2060,*(rpf_t **)(num + (int)rpf_start.next));
          }
          else {
            prStack_2060 = rpf_push(prStack_2060,
                                    (stack_t *)(&sp_num + (long)(int)rpf_start.next * 4));
          }
        }
        *rpf = (rpf_t *)rpf_start.value;
        expr_local._4_4_ = 1;
      }
      return expr_local._4_4_;
    }
    if (*(char *)rpf_local == '(') {
      rpf2._4_4_ = 0;
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*(char *)rpf_local] & 0x2000) != 0) {
        rpf_local = (rpf_t **)((long)rpf_local + 1);
      }
      for (pprStack_2070 = rpf_local; *(char *)pprStack_2070 != '\0';
          pprStack_2070 = (rpf_t **)((long)pprStack_2070 + 1)) {
        if (*(char *)pprStack_2070 == '(') {
          rpf2._4_4_ = rpf2._4_4_ + 1;
        }
        if (*(char *)pprStack_2070 == ')') {
          rpf2._4_4_ = rpf2._4_4_ + -1;
        }
        if (rpf2._4_4_ == 0) break;
      }
      if ((rpf2._4_4_ != 0) || (*(char *)pprStack_2070 == '\0')) {
        return 0;
      }
      iVar1 = formula((char *)((long)rpf_local + 1),&stack0xffffffffffffdf80,variable);
      if (iVar1 == 0) {
        return 0;
      }
      if (prStack_2080 != (rpf_t *)0x0) {
        (&sp_num)[(long)(int)rpf_start.next * 4] = 0;
        *(undefined4 *)((long)&num[(long)(int)rpf_start.next + -1].value + 4) = 5;
        *(rpf_t **)(num + (int)rpf_start.next) = prStack_2080;
        rpf_start.next._0_4_ = (int)rpf_start.next + 1;
      }
      rpf_local = pprStack_2070;
      end._4_4_ = 0;
    }
    else {
      if (*(char *)rpf_local == ')') {
        end._4_4_ = 0;
        goto LAB_00103a79;
      }
      if (*(char *)rpf_local == ',') {
        prVar6 = formula_output((stack_t *)&sp_num,(int *)&rpf_start.next,
                                (stack_t *)&num[0xff].value,(int *)((long)&rpf_start.next + 4),0);
        if (prVar6 == (rpf_t *)0x0) {
          return 0;
        }
        end._4_4_ = 0;
      }
      else {
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)*(char *)rpf_local] & 0x2000) == 0) {
          local_2c = 0;
LAB_00102f27:
          if (operation[local_2c].type == TYPE_MAX) goto LAB_00103717;
          pprVar3 = (rpf_t **)strstr((char *)rpf_local,operation[local_2c].op);
          if (pprVar3 != rpf_local) break;
          if ((rpf_start.next._4_4_ < 1) ||
             (*(int *)&num[(long)(rpf_start.next._4_4_ + -1) + 0xff].value !=
              operation[local_2c].rank)) {
            if ((0 < rpf_start.next._4_4_) &&
               ((operation[local_2c].rank <
                 *(int *)&num[(long)(rpf_start.next._4_4_ + -1) + 0xff].value &&
                (prVar6 = formula_output((stack_t *)&sp_num,(int *)&rpf_start.next,
                                         (stack_t *)&num[0xff].value,
                                         (int *)((long)&rpf_start.next + 4),operation[local_2c].rank
                                        ), prVar6 == (rpf_t *)0x0)))) {
              return 0;
            }
          }
          else {
            end_1._4_4_ = 1;
            prVar6 = formula_output((stack_t *)&sp_num,(int *)&rpf_start.next,
                                    (stack_t *)&num[(long)rpf_start.next._4_4_ + 0xfe].value,
                                    (int *)((long)&end_1 + 4),operation[local_2c].rank);
            if (prVar6 == (rpf_t *)0x0) {
              return 0;
            }
            rpf_start.next._4_4_ = rpf_start.next._4_4_ + -1;
          }
          sVar4 = strlen(operation[local_2c].op);
          rpf_local = (rpf_t **)(sVar4 + (long)rpf_local);
          while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*(char *)rpf_local] & 0x2000) != 0) {
            rpf_local = (rpf_t **)((long)rpf_local + 1);
          }
          if (((int)rpf_start.next == 0) && (operation[local_2c].func == math_sub)) {
            sp_num = 0;
            sp_op = 0;
            pvVar5 = malloc(8);
            *(void **)(num + (int)rpf_start.next) = pvVar5;
            **(undefined8 **)(num + (int)rpf_start.next) = 0xbff0000000000000;
            rpf_start.next._0_4_ = (int)rpf_start.next + 1;
            *(int *)&num[(long)rpf_start.next._4_4_ + 0xff].value = operation[0xb].rank;
            *(rpf_type_t *)((long)&num[(long)rpf_start.next._4_4_ + 0xff].value + 4) =
                 operation[0xb].type;
            op[rpf_start.next._4_4_].rank = 0x107280;
            op[rpf_start.next._4_4_].type = TYPE_VALUE;
            rpf_start.next._4_4_ = rpf_start.next._4_4_ + 1;
            end._4_4_ = 0;
            rpf_local = (rpf_t **)((long)rpf_local + -1);
          }
          else if ((end._4_4_ == 1) && (operation[local_2c].type != TYPE_MATH)) {
            if (operation[local_2c].func != math_sub) {
              return 0;
            }
            (&sp_num)[(long)(int)rpf_start.next * 4] = 0;
            *(undefined4 *)((long)&num[(long)(int)rpf_start.next + -1].value + 4) = 0;
            pvVar5 = malloc(8);
            *(void **)(num + (int)rpf_start.next) = pvVar5;
            **(undefined8 **)(num + (int)rpf_start.next) = 0xbff0000000000000;
            rpf_start.next._0_4_ = (int)rpf_start.next + 1;
            *(int *)&num[(long)rpf_start.next._4_4_ + 0xff].value = operation[0xb].rank;
            *(rpf_type_t *)((long)&num[(long)rpf_start.next._4_4_ + 0xff].value + 4) =
                 operation[0xb].type;
            op[rpf_start.next._4_4_].rank = 0x107280;
            op[rpf_start.next._4_4_].type = TYPE_VALUE;
            rpf_start.next._4_4_ = rpf_start.next._4_4_ + 1;
            end._4_4_ = 0;
            rpf_local = (rpf_t **)((long)rpf_local + -1);
          }
          else {
            if (operation[local_2c].type == TYPE_MATH) {
              *(int *)&num[(long)rpf_start.next._4_4_ + 0xff].value = operation[local_2c].rank;
              *(rpf_type_t *)((long)&num[(long)rpf_start.next._4_4_ + 0xff].value + 4) =
                   operation[local_2c].type;
              *(operation_t **)(op + rpf_start.next._4_4_) = operation + local_2c;
              rpf_start.next._4_4_ = rpf_start.next._4_4_ + 1;
              end._4_4_ = 0;
              if (0 < operation[local_2c].narg) {
                rpf2_1._4_4_ = 0;
                for (pprStack_2090 = rpf_local; *(char *)pprStack_2090 != '\0';
                    pprStack_2090 = (rpf_t **)((long)pprStack_2090 + 1)) {
                  if (*(char *)pprStack_2090 == '(') {
                    rpf2_1._4_4_ = rpf2_1._4_4_ + 1;
                  }
                  if (*(char *)pprStack_2090 == ')') {
                    rpf2_1._4_4_ = rpf2_1._4_4_ + -1;
                  }
                  if (rpf2_1._4_4_ == 0) break;
                }
                if ((rpf2_1._4_4_ != 0) || (*(char *)pprStack_2090 == '\0')) {
                  return 0;
                }
                iVar1 = formula((char *)((long)rpf_local + 1),(rpf_t **)&end_2,variable);
                if (iVar1 == 0) {
                  return 0;
                }
                if (end_2 == (char *)0x0) {
                  return 0;
                }
                (&sp_num)[(long)(int)rpf_start.next * 4] = 0;
                *(undefined4 *)((long)&num[(long)(int)rpf_start.next + -1].value + 4) = 5;
                *(char **)(num + (int)rpf_start.next) = end_2;
                prVar6 = rpf_last((rpf_t *)end_2);
                rpf_push(prVar6,(stack_t *)&num[(long)(rpf_start.next._4_4_ + -1) + 0xff].value);
                rpf_start.next._4_4_ = rpf_start.next._4_4_ + -1;
                rpf_start.next._0_4_ = (int)rpf_start.next + 1;
                rpf_local = (rpf_t **)((long)pprStack_2090 + 1);
              }
            }
            else {
              end._4_4_ = 1;
            }
            if (operation[local_2c].type != TYPE_MATH) {
              *(int *)&num[(long)rpf_start.next._4_4_ + 0xff].value = operation[local_2c].rank;
              *(rpf_type_t *)((long)&num[(long)rpf_start.next._4_4_ + 0xff].value + 4) =
                   operation[local_2c].type;
              *(operation_t **)(op + rpf_start.next._4_4_) = operation + local_2c;
              rpf_start.next._4_4_ = rpf_start.next._4_4_ + 1;
            }
            rpf_local = (rpf_t **)((long)rpf_local + -1);
          }
LAB_00103717:
          if (operation[local_2c].type != TYPE_MAX) goto LAB_00103a68;
          end._4_4_ = 0;
          ppuVar2 = __ctype_b_loc();
          if (((*ppuVar2)[(int)*(char *)rpf_local] & 0x400) == 0) {
            for (local_21b8 = rpf_local;
                (*(char *)local_21b8 != '\0' &&
                ((ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*(char *)local_21b8] & 0x800) != 0 ||
                 (((local_21b8 == rpf_local && (*(char *)local_21b8 == '-')) ||
                  (*(char *)local_21b8 == '.')))))); local_21b8 = (rpf_t **)((long)local_21b8 + 1))
            {
            }
            (&sp_num)[(long)(int)rpf_start.next * 4] = 0;
            *(undefined4 *)((long)&num[(long)(int)rpf_start.next + -1].value + 4) = 0;
            pvVar5 = malloc(8);
            *(void **)(num + (int)rpf_start.next) = pvVar5;
            dVar7 = strtod((char *)rpf_local,(char **)0x0);
            **(double **)(num + (int)rpf_start.next) = dVar7;
            rpf_start.next._0_4_ = (int)rpf_start.next + 1;
          }
          else {
            if (variable == (variables_t *)0x0) {
              return 0;
            }
            end_3._4_4_ = 0;
            variable_name._248_8_ = rpf_local;
            while ((*(char *)variable_name._248_8_ != '\0' &&
                   (((ppuVar2 = __ctype_b_loc(),
                     ((*ppuVar2)[(int)*(char *)variable_name._248_8_] & 8) != 0 ||
                     (*(char *)variable_name._248_8_ == '_')) ||
                    ((*(char *)variable_name._248_8_ == '[' ||
                     (*(char *)variable_name._248_8_ == ']'))))))) {
              local_21a8[end_3._4_4_] = *(char *)variable_name._248_8_;
              variable_name._248_8_ = variable_name._248_8_ + 1;
              end_3._4_4_ = end_3._4_4_ + 1;
            }
            local_21a8[end_3._4_4_] = '\0';
            end_3._4_4_ = 0;
            while (variable[end_3._4_4_].name != (char *)0x0) {
              iVar1 = strcmp(variable[end_3._4_4_].name,local_21a8);
              if (iVar1 == 0) {
                (&sp_num)[(long)(int)rpf_start.next * 4] = 0;
                *(undefined4 *)((long)&num[(long)(int)rpf_start.next + -1].value + 4) = 2;
                *(double **)(num + (int)rpf_start.next) = variable[end_3._4_4_].pointer;
                rpf_start.next._0_4_ = (int)rpf_start.next + 1;
                break;
              }
              end_3._4_4_ = end_3._4_4_ + 1;
            }
            local_21b8 = (rpf_t **)variable_name._248_8_;
            if (variable[end_3._4_4_].name == (char *)0x0) {
              return 0;
            }
          }
          rpf_local = (rpf_t **)((long)local_21b8 + -1);
        }
        else {
          end._4_4_ = 0;
        }
      }
    }
LAB_00103a68:
    rpf_local = (rpf_t **)((long)rpf_local + 1);
  } while( true );
  local_2c = local_2c + 1;
  goto LAB_00102f27;
}

Assistant:

int formula(const char *expr, struct rpf_t **rpf, const struct variables_t *variable)
{
  int i;
  struct stack_t op[256];
  struct stack_t num[256];
  int sp_op, sp_num;
  struct rpf_t rpf_start;
  struct rpf_t *rpf_tmp;
  *rpf = NULL;
  int op_cont;

  sp_num = 0;
  sp_op = 0;
  op_cont = 0;
  for (; *expr; expr++)
  {
    //printf( "[o%d/n%d] %s\n", sp_op, sp_num, expr );
    if (*expr == '(')
    {
      const char *end;
      int rank2;
      struct rpf_t *rpf2;

      rank2 = 0;
      for (; isspace(*expr); expr++)
        ;
      for (end = expr; *end; end++)
      {
        if (*end == '(')
          rank2++;
        if (*end == ')')
          rank2--;
        if (rank2 == 0)
          break;
      }
      if (rank2 || !(*end))
        return 0;
      if (formula(expr + 1, &rpf2, variable) == 0)
        return 0;
      if (rpf2)
      {
        num[sp_num].rank = 0;
        num[sp_num].type = TYPE_RPF;
        num[sp_num].value = rpf2;
        sp_num++;
      }

      expr = end;
      op_cont = 0;
      continue;
    }
    else if (*expr == ')')
    {
      op_cont = 0;
      break;
    }
    else if (*expr == ',')
    {
      if (formula_output(num, &sp_num, op, &sp_op, 0) == NULL)
        return 0;
      op_cont = 0;
      continue;
    }
    else if (isspace(*expr))
    {
      op_cont = 0;
      continue;
    }
    for (i = 0; operation[i].type != TYPE_MAX; i++)
    {
      if (strstr(expr, operation[i].op) == expr)
      {
        if (sp_op > 0 && op[sp_op - 1].rank == operation[i].rank)
        {
          int sp_op2;
          sp_op2 = 1;
          if (formula_output(num, &sp_num, op + sp_op - 1, &sp_op2, operation[i].rank) == NULL)
            return 0;
          sp_op--;
        }
        else if (sp_op > 0 && op[sp_op - 1].rank > operation[i].rank)
        {
          if (formula_output(num, &sp_num, op, &sp_op, operation[i].rank) == NULL)
            return 0;
        }
        expr += strlen(operation[i].op);
        for (; isspace(*expr); expr++)
          ;

        if (sp_num == 0 && operation[i].func == math_sub)
        {
          // Case: start with -
          num[sp_num].rank = 0;
          num[sp_num].type = TYPE_VALUE;
          num[sp_num].value = malloc(sizeof(double));
          *((double *)num[sp_num].value) = -1;
          sp_num++;
          op[sp_op].rank = operation[OPERATION_MUL].rank;
          op[sp_op].type = operation[OPERATION_MUL].type;
          op[sp_op].value = &operation[OPERATION_MUL];
          sp_op++;
          op_cont = 0;
          expr--;
          break;
        }
        else if (op_cont == 1 && operation[i].type != TYPE_MATH)
        {
          if (operation[i].func == math_sub)
          {
            // Case: x*-y
            num[sp_num].rank = 0;
            num[sp_num].type = TYPE_VALUE;
            num[sp_num].value = malloc(sizeof(double));
            *((double *)num[sp_num].value) = -1;
            sp_num++;
            op[sp_op].rank = operation[OPERATION_MUL].rank;
            op[sp_op].type = operation[OPERATION_MUL].type;
            op[sp_op].value = &operation[OPERATION_MUL];
            sp_op++;
            op_cont = 0;
            expr--;
            break;
          }
          else
          {
            // Case: x*/y (Error)
            return 0;
          }
        }

        if (operation[i].type != TYPE_MATH)
        {
          op_cont = 1;
        }
        else
        {
          op[sp_op].rank = operation[i].rank;
          op[sp_op].type = operation[i].type;
          op[sp_op].value = &operation[i];
          sp_op++;
          op_cont = 0;
          if (operation[i].narg > 0)
          {
            const char *end;
            int rank2;
            struct rpf_t *rpf2;

            rank2 = 0;

            for (end = expr; *end; end++)
            {
              if (*end == '(')
                rank2++;
              if (*end == ')')
                rank2--;
              if (rank2 == 0)
                break;
            }
            if (rank2 || !(*end))
              return 0;
            if (formula(expr + 1, &rpf2, variable) == 0)
              return 0;
            if (!rpf2)
              return 0;

            num[sp_num].rank = 0;
            num[sp_num].type = TYPE_RPF;
            num[sp_num].value = rpf2;
            rpf_push(rpf_last(rpf2), &op[sp_op - 1]);
            sp_op--;
            sp_num++;
            expr = end + 1;
          }
        }
        if (operation[i].type != TYPE_MATH)
        {
          op[sp_op].rank = operation[i].rank;
          op[sp_op].type = operation[i].type;
          op[sp_op].value = &operation[i];
          sp_op++;
        }
        expr--;

        break;
      }
    }
    if (operation[i].type != TYPE_MAX)
      continue;
    op_cont = 0;
    if (isalpha(*expr))
    {
      const char *end;
      char variable_name[256];
      int i;

      if (!variable)
        return 0;

      i = 0;
      for (end = expr; *end; end++)
      {
        if (!(isalnum(*end) || *end == '_' || *end == '[' || *end == ']'))
          break;
        variable_name[i++] = *end;
      }
      variable_name[i] = 0;

      for (i = 0; variable[i].name; i++)
      {
        if (strcmp(variable[i].name, variable_name) == 0)
        {
          num[sp_num].rank = 0;
          num[sp_num].type = TYPE_VARIABLE;
          num[sp_num].value = variable[i].pointer;
          sp_num++;
          break;
        }
      }
      if (!variable[i].name)
        return 0;
      expr = end - 1;
    }
    else
    {
      const char *end;

      for (end = expr; *end; end++)
      {
        if (!(isdigit(*end) || (end == expr && *end == '-') || *end == '.'))
          break;
      }
      num[sp_num].rank = 0;
      num[sp_num].type = TYPE_VALUE;
      num[sp_num].value = malloc(sizeof(double));
      *((double *)num[sp_num].value) = strtod(expr, NULL);
      sp_num++;
      expr = end - 1;
    }
  }
  if (formula_output(num, &sp_num, op, &sp_op, 0) == NULL)
    return 0;
  if (sp_num < 0 || sp_op != 0)
    return 0;

  rpf_start.type = TYPE_START;
  rpf_tmp = &rpf_start;
  for (sp_num--; sp_num >= 0; sp_num--)
  {
    switch (num[sp_num].type)
    {
      case TYPE_RPF:
        rpf_tmp = rpf_join(rpf_tmp, num[sp_num].value);
        break;
      default:
        rpf_tmp = rpf_push(rpf_tmp, &num[sp_num]);
        break;
    }
  }
  *rpf = rpf_start.next;
  return 1;
}